

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  void *pvVar22;
  void *pvVar23;
  long lVar24;
  long lVar25;
  undefined2 *puVar26;
  undefined2 *puVar27;
  uint *puVar28;
  void *pvVar29;
  undefined4 uVar30;
  void *pvVar31;
  long lVar32;
  void *pvVar33;
  void *pvVar34;
  void *pvVar35;
  undefined2 *puVar36;
  int i;
  long lVar37;
  long lVar38;
  void *pvVar39;
  void *pvVar40;
  void *pvVar41;
  void *pvVar42;
  void *pvVar43;
  void *pvVar44;
  undefined2 *puVar45;
  int q;
  int k;
  void *pvVar46;
  void *pvVar47;
  ulong uVar48;
  void *pvVar49;
  void *pvVar50;
  void *local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  void *local_e0;
  undefined1 local_c8 [64];
  size_t local_88;
  void *local_80;
  long local_78;
  long local_70;
  long local_68;
  undefined8 local_60;
  short tmp [6] [3];
  
  local_88 = 0;
  local_c8._0_8_ = (void *)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_8_ = 0;
  local_c8._24_4_ = 0;
  local_c8._32_8_ = (Allocator *)0x0;
  local_c8._40_4_ = 0;
  local_c8._44_4_ = 0;
  local_c8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  uVar48 = 0;
  Mat::create((Mat *)local_c8,0x24,inch,outch,2,(Allocator *)0x0);
  uVar19 = 0;
  if (0 < inch) {
    uVar19 = (ulong)(uint)inch;
  }
  uVar20 = 0;
  if (0 < outch) {
    uVar20 = (ulong)(uint)outch;
  }
  for (; uVar48 != uVar20; uVar48 = uVar48 + 1) {
    iVar18 = inch * 9 * (int)uVar48;
    pvVar22 = kernel->data;
    pvVar41 = (void *)(local_c8._16_8_ * local_88 * uVar48 + local_c8._0_8_);
    for (uVar21 = 0; uVar21 != uVar19; uVar21 = uVar21 + 1) {
      lVar37 = uVar21 * 9;
      cVar1 = *(char *)((long)pvVar22 + lVar37 + iVar18);
      cVar2 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 1);
      cVar3 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 2);
      cVar4 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 3);
      cVar5 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 4);
      cVar6 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 5);
      cVar7 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 6);
      cVar8 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 7);
      cVar9 = *(char *)((long)pvVar22 + lVar37 + (long)iVar18 + 8);
      for (lVar37 = 4; lVar37 != 0x28; lVar37 = lVar37 + 6) {
        sVar10 = *(short *)((long)&DAT_004c7958 + lVar37 + 4);
        sVar11 = *(short *)((long)&DAT_004c7958 + lVar37 + 6);
        sVar12 = *(short *)((long)&DAT_004c7960 + lVar37);
        *(short *)((long)tmp[-1] + lVar37 + 2) = sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
        *(short *)((long)tmp[-1] + lVar37 + 4) = sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
        *(short *)((long)tmp[0] + lVar37) = sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
      }
      pvVar23 = pvVar41;
      for (lVar37 = 0; lVar37 != 6; lVar37 = lVar37 + 1) {
        sVar10 = tmp[lVar37][0];
        uVar13 = *(uint *)(tmp[lVar37] + 1);
        puVar28 = &DAT_004c7962;
        for (lVar38 = 0; lVar38 != 6; lVar38 = lVar38 + 1) {
          auVar16 = vpmullw_avx(ZEXT416(*puVar28),ZEXT416(uVar13));
          uVar30 = vpextrw_avx(auVar16,1);
          *(short *)((long)pvVar23 + lVar38 * 2) =
               (short)uVar30 + auVar16._0_2_ + *(short *)((long)puVar28 + -2) * sVar10;
          puVar28 = (uint *)((long)puVar28 + 6);
        }
        pvVar23 = (void *)((long)pvVar23 + 0xc);
      }
      pvVar41 = (void *)((long)pvVar41 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
    }
  }
  Mat::create(kernel_tm,inch,0x24,(outch / 4) * -3 + outch,8,4,(Allocator *)0x0);
  lVar38 = (long)(int)local_c8._44_4_;
  lVar32 = local_c8._16_8_ * local_88;
  local_70 = kernel_tm->cstep * kernel_tm->elemsize;
  local_68 = (long)kernel_tm->w * kernel_tm->elemsize;
  lVar24 = local_c8._16_8_ * lVar38;
  local_110 = (void *)(lVar32 * 3 + local_c8._0_8_);
  local_78 = lVar32 * 4;
  lVar37 = lVar24 * 8;
  local_118 = (void *)(local_c8._0_8_ + lVar32 * 2);
  local_f0 = (void *)(lVar32 + local_c8._0_8_);
  local_f8 = (void *)((local_88 * 3 + lVar38) * local_c8._16_8_ + local_c8._0_8_);
  local_100 = (void *)((lVar38 + local_88 * 2) * local_c8._16_8_ + local_c8._0_8_);
  local_e8 = (void *)((local_88 + lVar38) * local_c8._16_8_ + local_c8._0_8_);
  local_e0 = (void *)local_c8._0_8_;
  local_108 = (void *)(lVar24 + local_c8._0_8_);
  local_80 = kernel_tm->data;
  for (uVar19 = 0; (long)(uVar19 | 3) < (long)outch; uVar19 = uVar19 + 4) {
    local_60 = (void *)((uVar19 >> 2) * local_70 + (long)local_80);
    pvVar22 = local_f8;
    pvVar41 = local_110;
    pvVar23 = local_e8;
    pvVar34 = local_e0;
    pvVar40 = local_f0;
    pvVar44 = local_108;
    pvVar47 = local_118;
    pvVar50 = local_100;
    for (lVar38 = 0; lVar38 != 0x24; lVar38 = lVar38 + 1) {
      pvVar35 = (void *)(local_68 * lVar38 + (long)local_60);
      pvVar29 = pvVar41;
      pvVar31 = pvVar23;
      pvVar33 = pvVar34;
      pvVar39 = pvVar40;
      pvVar42 = pvVar22;
      pvVar43 = pvVar44;
      pvVar46 = pvVar47;
      pvVar49 = pvVar50;
      for (uVar48 = 0; (long)(uVar48 | 7) < (long)inch; uVar48 = uVar48 + 8) {
        lVar32 = 0;
        for (lVar25 = 0; lVar25 != 0x40; lVar25 = lVar25 + 0x10) {
          *(undefined2 *)((long)pvVar35 + lVar25) = *(undefined2 *)((long)pvVar33 + lVar32);
          *(undefined2 *)((long)pvVar35 + lVar25 + 2) = *(undefined2 *)((long)pvVar43 + lVar32);
          *(undefined2 *)((long)pvVar35 + lVar25 + 4) = *(undefined2 *)((long)pvVar39 + lVar32);
          *(undefined2 *)((long)pvVar35 + lVar25 + 6) = *(undefined2 *)((long)pvVar31 + lVar32);
          *(undefined2 *)((long)pvVar35 + lVar25 + 8) = *(undefined2 *)((long)pvVar46 + lVar32);
          *(undefined2 *)((long)pvVar35 + lVar25 + 10) = *(undefined2 *)((long)pvVar49 + lVar32);
          *(undefined2 *)((long)pvVar35 + lVar25 + 0xc) = *(undefined2 *)((long)pvVar29 + lVar32);
          *(undefined2 *)((long)pvVar35 + lVar25 + 0xe) = *(undefined2 *)((long)pvVar42 + lVar32);
          lVar32 = lVar32 + lVar24 * 2;
        }
        pvVar29 = (void *)((long)pvVar29 + lVar37);
        pvVar46 = (void *)((long)pvVar46 + lVar37);
        pvVar39 = (void *)((long)pvVar39 + lVar37);
        pvVar33 = (void *)((long)pvVar33 + lVar37);
        pvVar42 = (void *)((long)pvVar42 + lVar37);
        pvVar49 = (void *)((long)pvVar49 + lVar37);
        pvVar31 = (void *)((long)pvVar31 + lVar37);
        pvVar43 = (void *)((long)pvVar43 + lVar37);
        pvVar35 = (void *)((long)pvVar35 + 0x40);
      }
      pvVar41 = (void *)((long)pvVar41 + 2);
      pvVar47 = (void *)((long)pvVar47 + 2);
      pvVar40 = (void *)((long)pvVar40 + 2);
      pvVar34 = (void *)((long)pvVar34 + 2);
      pvVar22 = (void *)((long)pvVar22 + 2);
      pvVar50 = (void *)((long)pvVar50 + 2);
      pvVar23 = (void *)((long)pvVar23 + 2);
      pvVar44 = (void *)((long)pvVar44 + 2);
    }
    local_110 = (void *)((long)local_110 + local_78);
    local_118 = (void *)((long)local_118 + local_78);
    local_f0 = (void *)((long)local_f0 + local_78);
    local_e0 = (void *)((long)local_e0 + local_78);
    local_f8 = (void *)((long)local_f8 + local_78);
    local_100 = (void *)((long)local_100 + local_78);
    local_e8 = (void *)((long)local_e8 + local_78);
    local_108 = (void *)((long)local_108 + local_78);
  }
  iVar18 = kernel_tm->w;
  pvVar22 = kernel_tm->data;
  sVar14 = kernel_tm->elemsize;
  sVar15 = kernel_tm->cstep;
  puVar26 = (undefined2 *)(local_c8._16_8_ * local_88 * uVar19 + local_c8._0_8_);
  for (; (long)uVar19 < (long)outch; uVar19 = uVar19 + 1) {
    puVar36 = puVar26;
    for (lVar37 = 0; lVar37 != 0x24; lVar37 = lVar37 + 1) {
      lVar38 = (long)pvVar22 +
               (long)iVar18 * sVar14 * lVar37 +
               (ulong)(((uint)uVar19 & 3) + ((uint)(uVar19 >> 2) & 0x3fffffff)) * sVar15 * sVar14;
      puVar27 = puVar36;
      for (uVar48 = 0; (long)(uVar48 | 7) < (long)inch; uVar48 = uVar48 + 8) {
        puVar45 = puVar27;
        for (lVar24 = 0; lVar24 != 0x10; lVar24 = lVar24 + 2) {
          *(undefined2 *)(lVar38 + lVar24) = *puVar45;
          puVar45 = (undefined2 *)((long)puVar45 + (long)(int)local_c8._44_4_ * local_c8._16_8_);
        }
        puVar27 = puVar27 + (long)(int)local_c8._44_4_ * local_c8._16_8_ * 4;
        lVar38 = lVar38 + 0x10;
      }
      puVar36 = puVar36 + 1;
    }
    puVar26 = (undefined2 *)((long)puVar26 + local_c8._16_8_ * local_88);
  }
  piVar17 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_c8._32_8_ == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_c8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_xop(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}